

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_parser_extras.cpp
# Opt level: O1

void __thiscall ast_compound_statement::print(ast_compound_statement *this)

{
  long *plVar1;
  exec_node *peVar2;
  exec_node **ppeVar3;
  
  puts("{");
  peVar2 = (this->statements).head_sentinel.next;
  ppeVar3 = &peVar2[-3].prev;
  if (ppeVar3 != (exec_node **)0x0 && peVar2->next != (exec_node *)0x0) {
    do {
      (*(code *)(*ppeVar3)->next)(ppeVar3);
      plVar1 = (long *)(ppeVar3 + 5);
      ppeVar3 = (exec_node **)((long *)*plVar1 + -5);
      if (*(long *)*plVar1 == 0) {
        ppeVar3 = (exec_node **)0x0;
      }
    } while (ppeVar3 != (exec_node **)0x0);
  }
  puts("}");
  return;
}

Assistant:

void
ast_compound_statement::print(void) const
{
   printf("{\n");

   foreach_list_typed(ast_node, ast, link, &this->statements) {
      ast->print();
   }

   printf("}\n");
}